

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O3

longlong FsSubSecondTimer(void)

{
  long lVar1;
  timeval tm;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  lVar1 = local_18.tv_usec / 1000 + local_18.tv_sec * 1000;
  if (lVar1 < FsSubSecondTimer::lastValue) {
    FsSubSecondTimer::base = FsSubSecondTimer::base + 86400000;
  }
  FsSubSecondTimer::lastValue = lVar1;
  if (FsSubSecondTimer()::first != '\x01') {
    FsSubSecondTimer::t0 = FsSubSecondTimer::base + lVar1;
    FsSubSecondTimer()::first = '\x01';
  }
  return (FsSubSecondTimer::base + lVar1) - FsSubSecondTimer::t0;
}

Assistant:

long long int FsSubSecondTimer(void)
{
	timeval tm;
	gettimeofday(&tm,NULL);
	long long int sec=tm.tv_sec;
	long long int usec=tm.tv_usec;

	long long int clk=sec*(long long int)1000+usec/(long long int)1000;


	static long long int lastValue=0;
	static long long int base=0;

	if(clk<lastValue) // Underflow.  It's tomorrow now.
	{
		base+=1000*3600*24;
	}
	lastValue=clk;

	static int first=1;
	static long long int t0=0;
	if(1==first)
	{
		t0=base+clk;
		first=0;
	}

	return base+clk-t0;
}